

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp_x86_fma::forward_inplace(BinaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RDI;
  Option *in_stack_00000100;
  float in_stack_0000010c;
  Mat *in_stack_00000110;
  int local_4;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 3) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 5) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 6) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 7) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_rsub>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8) {
    local_4 = binary_op_scalar_inplace<ncnn::BinaryOp_x86_fma_functor::binary_op_rdiv>
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BinaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_fma_functor;

    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);

    return 0;
}